

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Client::Client(Client *this)

{
  impl_ *this_00;
  sockaddr_in local_28;
  int local_14;
  Client *local_10;
  Client *this_local;
  
  this->_vptr_Client = (_func_int **)&PTR_NeedTick_003b0140;
  local_10 = this;
  this_00 = (impl_ *)operator_new(0x14);
  local_14 = socket(2,1,6);
  local_28.sin_family = 0;
  local_28.sin_port = 0;
  local_28.sin_addr.s_addr = 0;
  local_28.sin_zero[0] = '\0';
  local_28.sin_zero[1] = '\0';
  local_28.sin_zero[2] = '\0';
  local_28.sin_zero[3] = '\0';
  local_28.sin_zero[4] = '\0';
  local_28.sin_zero[5] = '\0';
  local_28.sin_zero[6] = '\0';
  local_28.sin_zero[7] = '\0';
  impl_::impl_(this_00,&local_14,&local_28);
  std::unique_ptr<Client::impl_,std::default_delete<Client::impl_>>::
  unique_ptr<std::default_delete<Client::impl_>,void>
            ((unique_ptr<Client::impl_,std::default_delete<Client::impl_>> *)&this->impl,this_00);
  this->server = (Server *)0x0;
  this->connected = false;
  this->connect_time = 0;
  std::__cxx11::string::string((string *)&this->recv_buffer);
  this->recv_buffer_gpos = 0;
  this->recv_buffer_ppos = 0;
  this->recv_buffer_used = 0;
  std::__cxx11::string::string((string *)&this->send_buffer);
  this->send_buffer_gpos = 0;
  this->send_buffer_ppos = 0;
  this->send_buffer_used = 0;
  return;
}

Assistant:

Client::Client()
	: impl(new impl_(socket(AF_INET, SOCK_STREAM, IPPROTO_TCP)))
	, server(0)
	, connected(false)
	, connect_time(0)
	, recv_buffer_gpos(0)
	, recv_buffer_ppos(0)
	, recv_buffer_used(0)
	, send_buffer_gpos(0)
	, send_buffer_ppos(0)
	, send_buffer_used(0)
{ }